

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManifestTest.cpp
# Opt level: O0

void __thiscall
ManifestTest_normalize_path_bad_working_directory_Test::
ManifestTest_normalize_path_bad_working_directory_Test
          (ManifestTest_normalize_path_bad_working_directory_Test *this)

{
  ManifestTest_normalize_path_bad_working_directory_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ManifestTest_normalize_path_bad_working_directory_Test_002e0b60;
  return;
}

Assistant:

TEST(ManifestTest, normalize_path_bad_working_directory) {
  EXPECT_EQ(normalize("", ""), "<failed to normalize>");
  EXPECT_EQ(normalize("k", ""), "<failed to normalize>");
  EXPECT_EQ(normalize(".", ""), "<failed to normalize>");
  EXPECT_EQ(normalize("..", ""), "<failed to normalize>");
  EXPECT_EQ(normalize("/", ""), "/");

  EXPECT_EQ(normalize("", "k"), "<failed to normalize>");
  EXPECT_EQ(normalize("k", "k"), "<failed to normalize>");
  EXPECT_EQ(normalize("..", "k"), "<failed to normalize>");
  EXPECT_EQ(normalize("/", "k"), "/k");

  EXPECT_EQ(normalize("", "."), "<failed to normalize>");
  EXPECT_EQ(normalize("k", "."), "<failed to normalize>");
  EXPECT_EQ(normalize("..", "."), "<failed to normalize>");
  EXPECT_EQ(normalize("/", "."), "/");

  EXPECT_EQ(normalize("", ".."), "<failed to normalize>");
  EXPECT_EQ(normalize("k", ".."), "<failed to normalize>");
  EXPECT_EQ(normalize("..", ".."), "<failed to normalize>");
  EXPECT_EQ(normalize("/", ".."), "/");
}